

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O3

void set_mimic_blocking(void)

{
  monst *pmVar1;
  
  pmVar1 = level->monlist;
  do {
    if (pmVar1 == (monst *)0x0) {
      return;
    }
    if ((0 < pmVar1->mhp) && ((pmVar1->field_0x60 & 2) != 0)) {
      if (pmVar1->m_ap_type == '\x02') {
        if (pmVar1->mappearance == 0x214) goto LAB_0016bff1;
      }
      else if ((pmVar1->m_ap_type == '\x01') && (pmVar1->mappearance - 0x1b < 2)) {
LAB_0016bff1:
        if ((u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0) &&
           (((youmonst.data)->mflags1 & 0x1000000) == 0)) {
          unblock_point((int)pmVar1->mx,(int)pmVar1->my);
        }
        else {
          block_point((int)pmVar1->mx,(int)pmVar1->my);
        }
      }
    }
    pmVar1 = pmVar1->nmon;
  } while( true );
}

Assistant:

void set_mimic_blocking(void)
{
    struct monst *mon;

    for (mon = level->monlist; mon; mon = mon->nmon) {
	if (DEADMONSTER(mon)) continue;
	if (mon->minvis &&
	   ((mon->m_ap_type == M_AP_FURNITURE &&
	     (mon->mappearance == S_vcdoor || mon->mappearance == S_hcdoor)) ||
	    (mon->m_ap_type == M_AP_OBJECT && mon->mappearance == BOULDER))) {
	    if (See_invisible)
		block_point(mon->mx, mon->my);
	    else
		unblock_point(mon->mx, mon->my);
	}
    }
}